

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

void __thiscall
duckdb::RLEState<unsigned_char>::Update<duckdb::RLECompressState<unsigned_char,true>::RLEWriter>
          (RLEState<unsigned_char> *this,uchar *data,ValidityMask *validity,idx_t idx)

{
  bool bVar1;
  unsigned_short uVar2;
  uint uVar3;
  long in_RCX;
  long in_RSI;
  TemplatedValidityMask<unsigned_long> *in_RDI;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (in_RDI,CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (bVar1) {
    if ((in_RDI->capacity & 1) == 0) {
      if (*(char *)&(in_RDI->validity_data).internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr == *(char *)(in_RSI + in_RCX)) {
        *(short *)((long)&(in_RDI->validity_data).internal.
                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 2) =
             *(short *)((long)&(in_RDI->validity_data).internal.
                               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + 2) + 1;
      }
      else {
        if (*(short *)((long)&(in_RDI->validity_data).internal.
                              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 2) != 0) {
          Flush<duckdb::RLECompressState<unsigned_char,true>::RLEWriter>
                    ((RLEState<unsigned_char> *)0xa5a4fc);
          in_RDI->validity_mask = (unsigned_long *)((long)in_RDI->validity_mask + 1);
        }
        *(undefined1 *)
         &(in_RDI->validity_data).internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = *(undefined1 *)(in_RSI + in_RCX);
        *(undefined2 *)
         ((long)&(in_RDI->validity_data).internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr + 2) = 1;
      }
    }
    else {
      *(undefined1 *)
       &(in_RDI->validity_data).internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = *(undefined1 *)(in_RSI + in_RCX);
      in_RDI->validity_mask = (unsigned_long *)((long)in_RDI->validity_mask + 1);
      *(short *)((long)&(in_RDI->validity_data).internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 2) =
           *(short *)((long)&(in_RDI->validity_data).internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + 2) + 1;
      *(undefined1 *)&in_RDI->capacity = 0;
    }
  }
  else {
    *(short *)((long)&(in_RDI->validity_data).internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 2) =
         *(short *)((long)&(in_RDI->validity_data).internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + 2) + 1;
  }
  uVar3 = (uint)*(ushort *)
                 ((long)&(in_RDI->validity_data).internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + 2);
  uVar2 = NumericLimits<unsigned_short>::Maximum();
  if (uVar3 == uVar2) {
    Flush<duckdb::RLECompressState<unsigned_char,true>::RLEWriter>
              ((RLEState<unsigned_char> *)0xa5a565);
    *(undefined2 *)
     ((long)&(in_RDI->validity_data).internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr + 2) = 0;
    in_RDI->validity_mask = (unsigned_long *)((long)in_RDI->validity_mask + 1);
  }
  return;
}

Assistant:

void Update(const T *data, ValidityMask &validity, idx_t idx) {
		if (validity.RowIsValid(idx)) {
			if (all_null) {
				// no value seen yet
				// assign the current value, and increment the seen_count
				// note that we increment last_seen_count rather than setting it to 1
				// this is intentional: this is the first VALID value we see
				// but it might not be the first value in case of nulls!
				last_value = data[idx];
				seen_count++;
				last_seen_count++;
				all_null = false;
			} else if (last_value == data[idx]) {
				// the last value is identical to this value: increment the last_seen_count
				last_seen_count++;
			} else {
				// the values are different
				// issue the callback on the last value
				// edge case: if a value has exactly 2^16 repeated values, we can end up here with last_seen_count = 0
				if (last_seen_count > 0) {
					Flush<OP>();
					seen_count++;
				}

				// increment the seen_count and put the new value into the RLE slot
				last_value = data[idx];
				last_seen_count = 1;
			}
		} else {
			// NULL value: we merely increment the last_seen_count
			last_seen_count++;
		}
		if (last_seen_count == NumericLimits<rle_count_t>::Maximum()) {
			// we have seen the same value so many times in a row we are at the limit of what fits in our count
			// write away the value and move to the next value
			Flush<OP>();
			last_seen_count = 0;
			seen_count++;
		}
	}